

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri_wrapper.hpp
# Opt level: O2

void __thiscall jsoncons::jsonschema::uri_wrapper::uri_wrapper(uri_wrapper *this,uri *uri)

{
  error_code ec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  string_view_type local_b8;
  uri local_a8;
  
  jsoncons::uri::uri(&this->uri_,uri);
  (this->identifier_)._M_dataplus._M_p = (pointer)&(this->identifier_).field_2;
  (this->identifier_)._M_string_length = 0;
  (this->identifier_).field_2._M_local_buf[0] = '\0';
  jsoncons::uri::uri(&local_a8,uri);
  jsoncons::uri::operator=(&this->uri_,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((this->uri_).fragment_part_.second == (this->uri_).fragment_part_.first) {
    this->has_plain_name_fragment_ = false;
  }
  else {
    jsoncons::uri::fragment_abi_cxx11_(&local_a8.uri_string_,&this->uri_);
    std::__cxx11::string::operator=((string *)&this->identifier_,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_a8.uri_string_._M_dataplus._M_p._0_4_ = 0;
    local_a8.uri_string_._M_string_length = std::_V2::system_category();
    local_b8._M_str = (this->identifier_)._M_dataplus._M_p;
    local_b8._M_len = (this->identifier_)._M_string_length;
    jsonpointer::basic_json_pointer<char>::parse
              ((basic_json_pointer<char> *)&local_d0,&local_b8,(error_code *)&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d0);
    this->has_plain_name_fragment_ = (int)local_a8.uri_string_._M_dataplus._M_p != 0;
  }
  return;
}

Assistant:

explicit uri_wrapper(const uri& uri)
            : uri_{uri}
        {
            uri_ = jsoncons::uri(uri);
            if (!uri_.encoded_fragment().empty())
            {
                identifier_ = uri_.fragment();
                std::error_code ec;
                jsonpointer::json_pointer::parse(identifier_, ec);
                has_plain_name_fragment_ = ec ? true : false;
            }
            else
            {
                has_plain_name_fragment_ = false;
            }
        }